

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  bool bVar5;
  uint uVar6;
  Limit limit;
  string *psVar7;
  FileDescriptorProto *this_00;
  uint8 *puVar8;
  uint uVar9;
  uint32 tag;
  int iVar10;
  uint32 local_44;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->file_to_generate_).super_RepeatedPtrFieldBase;
  local_40 = &(this->proto_file_).super_RepeatedPtrFieldBase;
LAB_001882b6:
  do {
    puVar8 = input->buffer_;
    if ((puVar8 < input->buffer_end_) && (tag = (uint32)(char)*puVar8, -1 < (char)*puVar8)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar8 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar9 = tag >> 3;
    uVar6 = tag & 7;
    if (uVar9 != 0xf) {
      if (uVar9 == 2) {
        if (uVar6 == 2) goto LAB_001883ce;
      }
      else if ((uVar9 == 1) && (uVar6 == 2)) {
        while( true ) {
          iVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
          iVar10 = (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar2 < iVar10) {
            ppvVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_;
            (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar7 = (string *)ppvVar3[iVar2];
          }
          else {
            if (iVar10 == (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_) {
              internal::RepeatedPtrFieldBase::Reserve(local_38,iVar10 + 1);
              iVar10 = (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_;
            }
            (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_ = iVar10 + 1;
            psVar7 = internal::StringTypeHandlerBase::New_abi_cxx11_();
            ppvVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_;
            iVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            ppvVar3[iVar2] = psVar7;
          }
          bVar5 = internal::WireFormatLite::ReadString(input,psVar7);
          if (!bVar5) {
            return false;
          }
          puVar4 = (undefined8 *)
                   (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_
                   [(long)(this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ + -1];
          internal::WireFormat::VerifyUTF8StringFallback((char *)*puVar4,*(int *)(puVar4 + 1),PARSE)
          ;
          puVar8 = input->buffer_;
          if (input->buffer_end_ <= puVar8) goto LAB_001882b6;
          if (*puVar8 != '\n') break;
          input->buffer_ = puVar8 + 1;
        }
        if (*puVar8 == '\x12') {
          input->buffer_ = puVar8 + 1;
LAB_001883ce:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          psVar7 = this->parameter_;
          if (psVar7 == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar7 = (string *)operator_new(0x20);
            (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
            psVar7->_M_string_length = 0;
            (psVar7->field_2)._M_local_buf[0] = '\0';
            this->parameter_ = psVar7;
          }
          bVar5 = internal::WireFormatLite::ReadString(input,psVar7);
          if (!bVar5) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
                     PARSE);
          puVar8 = input->buffer_;
          if ((puVar8 < input->buffer_end_) && (*puVar8 == 'z')) goto LAB_0018854d;
        }
        goto LAB_001882b6;
      }
LAB_00188446:
      if (uVar6 == 4) {
        return true;
      }
      bVar5 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      if (!bVar5) {
        return false;
      }
      goto LAB_001882b6;
    }
    if (uVar6 != 2) goto LAB_00188446;
    while( true ) {
      iVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
      iVar10 = (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar10) {
        ppvVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.elements_;
        (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (FileDescriptorProto *)ppvVar3[iVar2];
      }
      else {
        if (iVar10 == (this->proto_file_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve(local_40,iVar10 + 1);
          iVar10 = (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_ = iVar10 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
        ppvVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
        (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = this_00;
      }
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (uVar1 = *puVar8, -1 < (char)uVar1)) {
        input->buffer_ = puVar8 + 1;
        local_44 = (int)(char)uVar1;
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
        if (!bVar5) {
          return false;
        }
      }
      iVar2 = input->recursion_depth_;
      input->recursion_depth_ = iVar2 + 1;
      if (input->recursion_limit_ <= iVar2) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_44);
      bVar5 = FileDescriptorProto::MergePartialFromCodedStream(this_00,input);
      if (!bVar5) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar8 = input->buffer_;
      if ((input->buffer_end_ <= puVar8) || (*puVar8 != 'z')) break;
LAB_0018854d:
      input->buffer_ = puVar8 + 1;
    }
    if ((puVar8 == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file_to_generate:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_file_to_generate;
        if (input->ExpectTag(18)) goto parse_parameter;
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_parameter:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_proto_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}